

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O2

ExecutionResult * __thiscall
ASTNode::evaluate(ExecutionResult *__return_storage_ptr__,ASTNode *this,Context *context)

{
  _List_node_base *p_Var1;
  bool bVar2;
  uchar uVar3;
  long lVar4;
  longlong lVar5;
  longlong lVar6;
  _List_const_iterator<std::shared_ptr<ASTNode>_> _Var7;
  eval_error *peVar8;
  shared_ptr<SchemeObject> *value;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  string *psVar9;
  list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> num;
  list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> val_list;
  shared_ptr<SchemeObject> func;
  shared_ptr<SchemeProcedure> f;
  shared_ptr<SchemeSpecialForm> sf;
  _List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> local_68;
  string local_50;
  
  switch(this->type) {
  case NAME:
    val_list.
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    val_list.
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    psVar9 = &this->value;
    bVar2 = Context::get(context,psVar9,(shared_ptr<SchemeObject> *)&val_list);
    if (val_list.
        super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
        ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)0x0) {
      peVar8 = (eval_error *)__cxa_allocate_exception(0x10);
      if (bVar2) {
        std::operator+(&num,"Unassigned variable: ",psVar9);
        eval_error::runtime_error(peVar8,&num);
        __cxa_throw(peVar8,&eval_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::operator+(&num,"Undefined name: ",psVar9);
      eval_error::runtime_error(peVar8,&num);
      __cxa_throw(peVar8,&eval_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ExecutionResult::ExecutionResult(__return_storage_ptr__,(shared_ptr<SchemeObject> *)&val_list);
    this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              &val_list.
               super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    goto LAB_00125ea0;
  case INT:
    func.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)std::__cxx11::stoll(&this->value,(size_t *)0x0,10);
    std::make_shared<SchemeInt,long_long>((longlong *)&val_list);
    break;
  case FLOAT:
    psVar9 = &this->value;
    lVar4 = std::__cxx11::string::find((char)psVar9,0x2f);
    if (lVar4 == -1) {
      func.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)std::__cxx11::stod(psVar9,(size_t *)0x0);
    }
    else {
      std::__cxx11::string::substr((ulong)&num,(ulong)psVar9);
      std::__cxx11::string::substr((ulong)&val_list,(ulong)psVar9);
      lVar5 = std::__cxx11::stoll(&num,(size_t *)0x0,10);
      lVar6 = std::__cxx11::stoll((string *)&val_list,(size_t *)0x0,10);
      func.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)((double)lVar5 / (double)lVar6);
      std::__cxx11::string::~string((string *)&val_list);
      std::__cxx11::string::~string((string *)&num);
    }
    std::make_shared<SchemeFloat,double&>((double *)&val_list);
    break;
  case STRING:
    std::make_shared<SchemeString,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val_list);
    break;
  case BOOL:
    bVar2 = std::operator==(&this->value,"t");
    value = &scheme_false;
    if (bVar2) {
      value = &scheme_true;
    }
    ExecutionResult::ExecutionResult(__return_storage_ptr__,value);
    return __return_storage_ptr__;
  case CHAR:
    std::__cxx11::string::string((string *)&local_50,(string *)&this->value);
    uVar3 = char_name_to_char(&local_50);
    func.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT71(func.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr._1_7_,
                  uVar3);
    std::make_shared<SchemeChar,unsigned_char>((uchar *)&val_list);
    num._M_dataplus._M_p =
         (pointer)val_list.
                  super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
    num._M_string_length =
         (size_type)
         val_list.
         super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
         ._M_impl._M_node.super__List_node_base._M_prev;
    val_list.
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    val_list.
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    ExecutionResult::ExecutionResult(__return_storage_ptr__,(shared_ptr<SchemeObject> *)&num);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&num._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &val_list.
                super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev);
    std::__cxx11::string::~string((string *)&local_50);
    return __return_storage_ptr__;
  case VECTOR:
    peVar8 = (eval_error *)__cxa_allocate_exception(0x10);
    eval_error::runtime_error(peVar8,"Trying to evaluate a vector");
LAB_00125ef0:
    __cxa_throw(peVar8,&eval_error::typeinfo,std::runtime_error::~runtime_error);
  default:
    p_Var1 = (this->list).
             super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    __x = &this->list;
    if (p_Var1 == (_List_node_base *)__x) {
      peVar8 = (eval_error *)__cxa_allocate_exception(0x10);
      eval_error::runtime_error(peVar8,"Trying to evaluate empty list");
      goto LAB_00125ef0;
    }
    evaluate((ExecutionResult *)&num,(ASTNode *)p_Var1[1]._M_next,context);
    ExecutionResult::force_value((ExecutionResult *)&func);
    ExecutionResult::~ExecutionResult((ExecutionResult *)&num);
    std::dynamic_pointer_cast<SchemeSpecialForm,SchemeObject>((shared_ptr<SchemeObject> *)&sf);
    if (sf.super___shared_ptr<SchemeSpecialForm,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::dynamic_pointer_cast<SchemeProcedure,SchemeObject>((shared_ptr<SchemeObject> *)&f);
      if (f.super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        peVar8 = (eval_error *)__cxa_allocate_exception(0x10);
        eval_error::runtime_error(peVar8,"Trying to call not a function");
        __cxa_throw(peVar8,&eval_error::typeinfo,std::runtime_error::~runtime_error);
      }
      val_list.
      super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&val_list;
      val_list.
      super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
      ._M_impl._M_node._M_size = 0;
      val_list.
      super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           val_list.
           super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      _Var7 = std::next<std::_List_const_iterator<std::shared_ptr<ASTNode>>>
                        ((__x->
                         super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                         )._M_impl._M_node.super__List_node_base._M_next,1);
      for (; _Var7._M_node != (_List_node_base *)__x; _Var7._M_node = (_Var7._M_node)->_M_next) {
        evaluate((ExecutionResult *)&num,(ASTNode *)_Var7._M_node[1]._M_next,context);
        ExecutionResult::force_value((ExecutionResult *)&stack0xffffffffffffff78);
        std::__cxx11::
        list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
        push_back(&val_list,(value_type *)&stack0xffffffffffffff78);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff80);
        ExecutionResult::~ExecutionResult((ExecutionResult *)&num);
      }
      ExecutionResult::ExecutionResult(__return_storage_ptr__,&f,&val_list);
      std::__cxx11::
      _List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
      _M_clear(&val_list.
                super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
              );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&f.super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
      std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::list
                ((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)
                 &local_68,__x);
      SchemeSpecialForm::execute
                (__return_storage_ptr__,
                 sf.super___shared_ptr<SchemeSpecialForm,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)
                 &local_68,context);
      std::__cxx11::_List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
      ::_M_clear(&local_68);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sf.super___shared_ptr<SchemeSpecialForm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    this_00 = &func.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    goto LAB_00125ea0;
  }
  this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            &val_list.
             super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
  num._M_dataplus._M_p =
       (pointer)val_list.
                super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
  num._M_string_length =
       (size_type)
       val_list.
       super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
       ._M_impl._M_node.super__List_node_base._M_prev;
  val_list.
  super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  val_list.
  super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  ExecutionResult::ExecutionResult(__return_storage_ptr__,(shared_ptr<SchemeObject> *)&num);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&num._M_string_length);
LAB_00125ea0:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  return __return_storage_ptr__;
}

Assistant:

ExecutionResult ASTNode::evaluate(const Context &context) const
{

    if(type == ast_type_t::INT)
        try
        {
            return ExecutionResult(std::make_shared<SchemeInt>(stoll(value)));
        }
        catch(std::out_of_range &)
        {
            throw eval_error("Invalid integer: " + value);
        }
    if(type == ast_type_t::FLOAT)
    {
        double float_val;
        try
        {
            auto slash_pos = value.find('/');
            if (slash_pos != std::string::npos)
            {
                auto num = value.substr(0, slash_pos);
                auto den = value.substr(slash_pos + 1);
                float_val = double(stoll(num)) / double(stoll(den));
            }
            else
            {
                float_val = stod(value);
            }
        }
        catch(std::out_of_range &)
        {
            throw eval_error("Invalid float: " + value);
        }
        return ExecutionResult(std::make_shared<SchemeFloat>(float_val));
    }
    if(type == ast_type_t::STRING)
        return ExecutionResult(std::make_shared<SchemeString>(value));
    if(type == ast_type_t::CHAR)
        return ExecutionResult(std::make_shared<SchemeChar>(char_name_to_char(value)));
    if(type == ast_type_t::BOOL)
        return ExecutionResult(value == "t" ? scheme_true : scheme_false);
    if(type == ast_type_t::NAME)
    {
        std::shared_ptr<SchemeObject> t{nullptr};
        bool res = context.get(value, t);
        if(t)
            return ExecutionResult(t);
        else if(res)
            throw eval_error("Unassigned variable: " + value);
        else
            throw eval_error("Undefined name: " + value);
    }
    if(type == ast_type_t::VECTOR)
        throw eval_error("Trying to evaluate a vector");
    if(list.empty())
        throw eval_error("Trying to evaluate empty list");

    auto func = list.front()->evaluate(context).force_value();
    auto sf = std::dynamic_pointer_cast<SchemeSpecialForm>(func);
    if(sf)
    {
        return sf->execute(list, context);
    }
    auto f = std::dynamic_pointer_cast<SchemeProcedure>(func);
    if(!f)
    {
        throw eval_error("Trying to call not a function");
    }
    std::list<std::shared_ptr<SchemeObject>> val_list;
    for(auto lit = std::next(list.begin()); lit != list.end(); ++lit)
    {
        val_list.push_back((*lit)->evaluate(context).force_value());
    }
    return ExecutionResult(f, val_list);
}